

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

void __thiscall
glcts::FormatInfo::FormatInfo(FormatInfo *this,GLenum internalFormat,GLuint offsetAlignment)

{
  GLuint offsetAlignment_local;
  GLenum internalFormat_local;
  FormatInfo *this_local;
  
  this->m_aligned_size = 0;
  this->m_not_aligned_size = 0;
  this->m_ssbo_value_size = 0;
  this->m_internal_format = internalFormat;
  this->m_offset_alignment = offsetAlignment;
  this->m_n_components = 0;
  this->m_input_type = 0;
  this->m_output_type = 0;
  this->m_is_image_supported = '\0';
  std::__cxx11::string::string((string *)&this->m_image_format_name);
  std::__cxx11::string::string((string *)&this->m_image_type_name);
  std::__cxx11::string::string((string *)&this->m_sampler_type_name);
  std::__cxx11::string::string((string *)&this->m_output_type_name);
  std::__cxx11::string::string((string *)&this->m_value_selector);
  configure(this);
  return;
}

Assistant:

FormatInfo::FormatInfo(glw::GLenum internalFormat, glw::GLuint offsetAlignment)
	: m_aligned_size(0)
	, m_not_aligned_size(0)
	, m_ssbo_value_size(0)
	, m_internal_format(internalFormat)
	, m_offset_alignment(offsetAlignment)
	, m_n_components(0)
	, m_input_type(GL_NONE)
	, m_output_type(GL_NONE)
	, m_is_image_supported(false)
{
	configure();
}